

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
groundupdbext::EmbeddedDatabase::createEmpty
          (string *dbname,
          unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
          *kvStore,unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                   *idxStore)

{
  KeyValueStore *pKVar1;
  _Head_base<0UL,_groundupdb::KeyValueStore_*,_false> local_48 [2];
  KeyValueStore local_38 [2];
  
  pKVar1 = (kvStore->_M_t).
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  local_48[0]._M_head_impl = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pKVar1,
             (long)&((kvStore[1]._M_t.
                      super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
                      .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl)->
                    super_Store)._vptr_Store + (long)&(pKVar1->super_Store)._vptr_Store);
  Impl::createEmpty(dbname,(unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                            *)local_48,idxStore);
  if (local_48[0]._M_head_impl != local_38) {
    operator_delete(local_48[0]._M_head_impl,(long)local_38[0].super_Store._vptr_Store + 1);
  }
  return (__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
            )dbname;
}

Assistant:

const std::unique_ptr<IDatabase> EmbeddedDatabase::createEmpty(std::string dbname,std::unique_ptr<KeyValueStore>& kvStore,std::unique_ptr<KeyValueStore>& idxStore) {
  return EmbeddedDatabase::Impl::createEmpty(dbname, kvStore, idxStore);
}